

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int s_mp_exptmod(mp_int *G,mp_int *X,mp_int *P,mp_int *Y,int redmode)

{
  mp_int *c;
  mp_digit *pmVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  code *pcVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  mp_int *pmVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  mp_digit mVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  int local_18d8;
  uint local_18d4;
  int local_18c0;
  mp_int res;
  mp_int mu;
  mp_int t;
  mp_int M [256];
  
  uVar4 = mp_count_bits(X);
  if ((int)uVar4 < 8) {
    iVar13 = 2;
  }
  else if (uVar4 < 0x25) {
    iVar13 = 3;
  }
  else if (uVar4 < 0x8d) {
    iVar13 = 4;
  }
  else if (uVar4 < 0x1c3) {
    iVar13 = 5;
  }
  else if (uVar4 < 0x518) {
    iVar13 = 6;
  }
  else {
    iVar13 = 8 - (uint)(uVar4 < 0xdca);
  }
  iVar5 = mp_init(M + 1);
  if (iVar5 != 0) {
    return iVar5;
  }
  iVar5 = iVar13 + -1;
  uVar16 = (ulong)(uint)(1 << ((byte)iVar5 & 0x1f));
  uVar4 = 1 << ((byte)iVar13 & 0x1f);
  uVar17 = (ulong)uVar4;
  pmVar11 = M + uVar16;
  for (uVar12 = uVar16; uVar12 < uVar17; uVar12 = uVar12 + 1) {
    iVar6 = mp_init(pmVar11);
    if (iVar6 != 0) {
      pmVar11 = M + uVar16;
      for (; uVar16 < uVar12; uVar16 = uVar16 + 1) {
        mp_clear(pmVar11);
        pmVar11 = pmVar11 + 1;
      }
      mp_clear(M + 1);
      return iVar6;
    }
    pmVar11 = pmVar11 + 1;
  }
  iVar6 = mp_init(&mu);
  if (iVar6 != 0) goto LAB_00106b5d;
  if (redmode == 0) {
    iVar6 = mp_reduce_setup(&mu,P);
    if (iVar6 == 0) {
      pcVar7 = mp_reduce;
      goto LAB_00106b11;
    }
  }
  else {
    iVar6 = mp_reduce_2k_setup_l(P,&mu);
    if (iVar6 == 0) {
      pcVar7 = mp_reduce_2k_l;
LAB_00106b11:
      iVar6 = mp_mod(G,P,M + 1);
      if (iVar6 == 0) {
        pmVar11 = M + uVar16;
        iVar6 = mp_copy(M + 1,pmVar11);
        if (iVar6 == 0) {
          iVar14 = 0;
          if (0 < iVar5) {
            iVar14 = iVar5;
          }
          iVar14 = iVar14 + 1;
          do {
            iVar14 = iVar14 + -1;
            uVar12 = uVar16;
            if (iVar14 == 0) goto LAB_00106bd6;
            iVar6 = mp_sqr(pmVar11,pmVar11);
          } while ((iVar6 == 0) && (iVar6 = (*pcVar7)(pmVar11,P,&mu), iVar6 == 0));
        }
      }
    }
  }
  goto LAB_00106b53;
  while( true ) {
    c = pmVar11 + 1;
    iVar6 = mp_mul(pmVar11,M + 1,c);
    if (iVar6 != 0) break;
    pmVar11 = pmVar11 + 1;
    iVar6 = (*pcVar7)(c,P,&mu);
    uVar12 = uVar12 + 1;
    if (iVar6 != 0) break;
LAB_00106bd6:
    if (uVar17 <= uVar12 + 1) {
      iVar6 = mp_init(&res);
      if (iVar6 == 0) {
        mp_set(&res,1);
        local_18c0 = X->used + -1;
        mVar15 = 0;
        local_18d4 = 0;
        local_18d8 = 0;
        iVar5 = 1;
        iVar14 = 0;
        goto LAB_00106c6c;
      }
      break;
    }
  }
  goto LAB_00106b53;
  while (iVar14 = 1, iVar6 == 0) {
LAB_00106c6c:
    do {
      iVar6 = iVar14;
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) {
        if (local_18c0 == -1) {
          if (local_18d8 < 1 || iVar6 != 2) goto LAB_00106e1e;
          goto LAB_00106db3;
        }
        lVar9 = (long)local_18c0;
        local_18c0 = local_18c0 + -1;
        mVar15 = X->dp[lVar9];
        iVar5 = 0x3c;
      }
      uVar8 = (uint)(mVar15 >> 0x3b) & 1;
      mVar15 = mVar15 * 2;
      iVar14 = 0;
    } while (iVar6 == 0 && uVar8 == 0);
    if ((iVar6 == 1) && (uVar8 == 0)) {
      iVar6 = mp_sqr(&res,&res);
      if (iVar6 != 0) break;
      iVar6 = (*pcVar7)(&res,P,&mu);
    }
    else {
      local_18d8 = local_18d8 + 1;
      local_18d4 = local_18d4 | uVar8 << ((byte)iVar13 - (char)local_18d8 & 0x1f);
      iVar10 = iVar13 + 1;
      iVar14 = 2;
      if (iVar13 != local_18d8) goto LAB_00106c6c;
      while( true ) {
        if (iVar10 + -1 == 0) break;
        iVar6 = mp_sqr(&res,&res);
        if ((iVar6 != 0) || (iVar6 = (*pcVar7)(&res,P,&mu), iVar10 = iVar10 + -1, iVar6 != 0))
        goto LAB_00106e0f;
      }
      iVar6 = mp_mul(&res,M + (int)local_18d4,&res);
      if (iVar6 != 0) break;
      iVar6 = (*pcVar7)(&res,P,&mu);
      local_18d4 = 0;
      local_18d8 = 0;
    }
  }
  goto LAB_00106e0f;
LAB_00106e1e:
  pmVar1 = Y->dp;
  uVar2._0_4_ = Y->used;
  uVar2._4_4_ = Y->alloc;
  uVar3._0_4_ = Y->sign;
  uVar3._4_4_ = *(undefined4 *)&Y->field_0xc;
  Y->used = res.used;
  Y->alloc = res.alloc;
  Y->sign = res.sign;
  *(undefined4 *)&Y->field_0xc = res._12_4_;
  Y->dp = res.dp;
  iVar6 = 0;
  res._0_8_ = uVar2;
  res._8_8_ = uVar3;
  res.dp = pmVar1;
  goto LAB_00106e0f;
  while (((iVar6 = mp_sqr(&res,&res), iVar6 == 0 && (iVar6 = (*pcVar7)(&res,P,&mu), iVar6 == 0)) &&
         ((local_18d4 = local_18d4 * 2, (local_18d4 & uVar4) == 0 ||
          ((iVar6 = mp_mul(&res,M + 1,&res), iVar6 == 0 &&
           (iVar6 = (*pcVar7)(&res,P,&mu), iVar6 == 0))))))) {
LAB_00106db3:
    bVar18 = local_18d8 == 0;
    local_18d8 = local_18d8 + -1;
    if (bVar18) goto LAB_00106e1e;
  }
LAB_00106e0f:
  mp_clear(&res);
LAB_00106b53:
  mp_clear(&mu);
LAB_00106b5d:
  mp_clear(M + 1);
  pmVar11 = M + uVar16;
  for (; uVar16 < uVar17; uVar16 = uVar16 + 1) {
    mp_clear(pmVar11);
    pmVar11 = pmVar11 + 1;
  }
  return iVar6;
}

Assistant:

int s_mp_exptmod (mp_int * G, mp_int * X, mp_int * P, mp_int * Y, int redmode)
{
  mp_int  M[TAB_SIZE], res, mu;
  mp_digit buf;
  int     err, bitbuf, bitcpy, bitcnt, mode, digidx, x, y, winsize;
  int (*redux)(mp_int*,mp_int*,mp_int*);

  /* find window size */
  x = mp_count_bits (X);
  if (x <= 7) {
    winsize = 2;
  } else if (x <= 36) {
    winsize = 3;
  } else if (x <= 140) {
    winsize = 4;
  } else if (x <= 450) {
    winsize = 5;
  } else if (x <= 1303) {
    winsize = 6;
  } else if (x <= 3529) {
    winsize = 7;
  } else {
    winsize = 8;
  }

  /* init M array */
  /* init first cell */
  if ((err = mp_init(&M[1])) != MP_OKAY) {
     return err; 
  }

  /* now init the second half of the array */
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    if ((err = mp_init(&M[x])) != MP_OKAY) {
      for (y = 1<<(winsize-1); y < x; y++) {
        mp_clear (&M[y]);
      }
      mp_clear(&M[1]);
      return err;
    }
  }

  /* create mu, used for Barrett reduction */
  if ((err = mp_init (&mu)) != MP_OKAY) {
    goto LBL_M;
  }
  
  if (redmode == 0) {
     if ((err = mp_reduce_setup (&mu, P)) != MP_OKAY) {
        goto LBL_MU;
     }
     redux = mp_reduce;
  } else {
     if ((err = mp_reduce_2k_setup_l (P, &mu)) != MP_OKAY) {
        goto LBL_MU;
     }
     redux = mp_reduce_2k_l;
  }    

  /* create M table
   *
   * The M table contains powers of the base, 
   * e.g. M[x] = G**x mod P
   *
   * The first half of the table is not 
   * computed though accept for M[0] and M[1]
   */
  if ((err = mp_mod (G, P, &M[1])) != MP_OKAY) {
    goto LBL_MU;
  }

  /* compute the value at M[1<<(winsize-1)] by squaring 
   * M[1] (winsize-1) times 
   */
  if ((err = mp_copy (&M[1], &M[1 << (winsize - 1)])) != MP_OKAY) {
    goto LBL_MU;
  }

  for (x = 0; x < (winsize - 1); x++) {
    /* square it */
    if ((err = mp_sqr (&M[1 << (winsize - 1)], 
                       &M[1 << (winsize - 1)])) != MP_OKAY) {
      goto LBL_MU;
    }

    /* reduce modulo P */
    if ((err = redux (&M[1 << (winsize - 1)], P, &mu)) != MP_OKAY) {
      goto LBL_MU;
    }
  }

  /* create upper table, that is M[x] = M[x-1] * M[1] (mod P)
   * for x = (2**(winsize - 1) + 1) to (2**winsize - 1)
   */
  for (x = (1 << (winsize - 1)) + 1; x < (1 << winsize); x++) {
    if ((err = mp_mul (&M[x - 1], &M[1], &M[x])) != MP_OKAY) {
      goto LBL_MU;
    }
    if ((err = redux (&M[x], P, &mu)) != MP_OKAY) {
      goto LBL_MU;
    }
  }

  /* setup result */
  if ((err = mp_init (&res)) != MP_OKAY) {
    goto LBL_MU;
  }
  mp_set (&res, 1);

  /* set initial mode and bit cnt */
  mode   = 0;
  bitcnt = 1;
  buf    = 0;
  digidx = X->used - 1;
  bitcpy = 0;
  bitbuf = 0;

  for (;;) {
    /* grab next digit as required */
    if (--bitcnt == 0) {
      /* if digidx == -1 we are out of digits */
      if (digidx == -1) {
        break;
      }
      /* read next digit and reset the bitcnt */
      buf    = X->dp[digidx--];
      bitcnt = (int) DIGIT_BIT;
    }

    /* grab the next msb from the exponent */
    y     = (buf >> (mp_digit)(DIGIT_BIT - 1)) & 1;
    buf <<= (mp_digit)1;

    /* if the bit is zero and mode == 0 then we ignore it
     * These represent the leading zero bits before the first 1 bit
     * in the exponent.  Technically this opt is not required but it
     * does lower the # of trivial squaring/reductions used
     */
    if (mode == 0 && y == 0) {
      continue;
    }

    /* if the bit is zero and mode == 1 then we square */
    if (mode == 1 && y == 0) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }
      continue;
    }

    /* else we add it to the window */
    bitbuf |= (y << (winsize - ++bitcpy));
    mode    = 2;

    if (bitcpy == winsize) {
      /* ok window is filled so square as required and multiply  */
      /* square first */
      for (x = 0; x < winsize; x++) {
        if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, &mu)) != MP_OKAY) {
          goto LBL_RES;
        }
      }

      /* then multiply */
      if ((err = mp_mul (&res, &M[bitbuf], &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* empty window and reset */
      bitcpy = 0;
      bitbuf = 0;
      mode   = 1;
    }
  }

  /* if bits remain then square/multiply */
  if (mode == 2 && bitcpy > 0) {
    /* square then multiply if the bit is set */
    for (x = 0; x < bitcpy; x++) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }

      bitbuf <<= 1;
      if ((bitbuf & (1 << winsize)) != 0) {
        /* then multiply */
        if ((err = mp_mul (&res, &M[1], &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, &mu)) != MP_OKAY) {
          goto LBL_RES;
        }
      }
    }
  }

  mp_exch (&res, Y);
  err = MP_OKAY;
LBL_RES:mp_clear (&res);
LBL_MU:mp_clear (&mu);
LBL_M:
  mp_clear(&M[1]);
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    mp_clear (&M[x]);
  }
  return err;
}